

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

tmbstr ParseAttribute(TidyDocImpl *doc,Bool *isempty,Node **asp,Node **php)

{
  Lexer *pLVar1;
  uint uVar2;
  uint uVar3;
  uint c;
  uint c_00;
  tmbstr ptVar4;
  Node *pNVar5;
  StreamIn *in;
  
  pLVar1 = doc->lexer;
  *asp = (Node *)0x0;
  *php = (Node *)0x0;
LAB_00144276:
  while( true ) {
    uVar2 = prvTidyReadChar(doc->docIn);
    uVar3 = 0x28a;
    if ((uVar2 != 0x22) && (uVar2 != 0x27)) break;
LAB_001442d8:
    prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,uVar3);
  }
  if (uVar2 == 0x3d) {
    uVar3 = 0x288;
    goto LAB_001442d8;
  }
  if (uVar2 == 0xffffffff) {
    prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,0x283);
    prvTidyUngetChar(0xffffffff,doc->docIn);
    return (tmbstr)0x0;
  }
  if (uVar2 == 0x3e) {
    return (tmbstr)0x0;
  }
  if (uVar2 == 0x3c) {
    uVar2 = prvTidyReadChar(doc->docIn);
    if (uVar2 == 0x3f) {
      pLVar1 = doc->lexer;
      pLVar1->txtstart = pLVar1->lexsize;
      goto LAB_001444e8;
    }
    if (uVar2 != 0x25) {
      prvTidyUngetChar(uVar2,doc->docIn);
      prvTidyUngetChar(0x3c,doc->docIn);
      prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,0x289);
      return (tmbstr)0x0;
    }
    pLVar1 = doc->lexer;
    pLVar1->txtstart = pLVar1->lexsize;
    goto LAB_0014433c;
  }
  if (uVar2 != 0x2f) {
    if ((0x7f < uVar2) || ((lexmap[uVar2] & 8) == 0)) goto LAB_001443c3;
    goto LAB_00144276;
  }
  uVar3 = prvTidyReadChar(doc->docIn);
  if (uVar3 == 0x3e) {
    *isempty = yes;
    return (tmbstr)0x0;
  }
  prvTidyUngetChar(uVar3,doc->docIn);
LAB_001443c3:
  uVar3 = pLVar1->lexsize;
  c_00 = uVar2;
  while( true ) {
    if (((uVar2 - 0x3d < 2) || (uVar2 == 0x3c)) || (uVar2 == 0xffffffff)) goto LAB_0014449d;
    if ((c_00 == 0x2d) && ((uVar2 == 0x27 || (uVar2 == 0x22)))) break;
    if (uVar2 < 0x80) {
      if ((lexmap[uVar2] & 8) != 0) goto LAB_001444ac;
      if (uVar2 == 0x2f) {
        c = prvTidyReadChar(doc->docIn);
        in = doc->docIn;
        if (c == 0x3e) {
          uVar2 = 0x3e;
          goto LAB_001444a7;
        }
        prvTidyUngetChar(c,in);
      }
    }
    c_00 = uVar2;
    if ((((doc->config).value[0x54].v != 2) && (uVar2 < 0x80)) &&
       ((*(int *)((doc->config).value + 0x67) == 0 && ((lexmap[uVar2] & 0x40) != 0)))) {
      c_00 = prvTidyToLower(uVar2);
    }
    prvTidyAddCharToLexer(pLVar1,c_00);
    uVar2 = prvTidyReadChar(doc->docIn);
  }
  pLVar1->lexsize = pLVar1->lexsize - 1;
LAB_0014449d:
  in = doc->docIn;
LAB_001444a7:
  prvTidyUngetChar(uVar2,in);
LAB_001444ac:
  uVar2 = pLVar1->lexsize - uVar3;
  if ((int)uVar2 < 1) {
    ptVar4 = (tmbstr)0x0;
  }
  else {
    ptVar4 = prvTidytmbstrndup(doc->allocator,pLVar1->lexbuf + (int)uVar3,uVar2);
  }
  pLVar1->lexsize = uVar3;
  return ptVar4;
  while( true ) {
    uVar2 = prvTidyReadChar(doc->docIn);
    if (uVar2 == 0xffffffff) goto LAB_00144591;
    prvTidyAddCharToLexer(pLVar1,uVar2);
    if (uVar2 == 0x3e) break;
LAB_001444e8:
    do {
      uVar2 = prvTidyReadChar(doc->docIn);
      if (uVar2 == 0xffffffff) {
LAB_00144591:
        uVar2 = pLVar1->lexsize;
        goto LAB_00144595;
      }
      prvTidyAddCharToLexer(pLVar1,uVar2);
    } while (uVar2 != 0x3f);
  }
  uVar2 = pLVar1->lexsize - 2;
  pLVar1->lexsize = uVar2;
LAB_00144595:
  pLVar1->txtend = uVar2;
  if (pLVar1->txtstart < uVar2) {
    pNVar5 = NewToken(doc,PhpTag);
    uVar2 = pLVar1->txtend;
  }
  else {
    pNVar5 = (Node *)0x0;
  }
  pLVar1->txtstart = uVar2;
  *php = pNVar5;
  return (tmbstr)0x0;
  while( true ) {
    uVar2 = prvTidyReadChar(doc->docIn);
    if (uVar2 == 0xffffffff) goto LAB_00144572;
    prvTidyAddCharToLexer(pLVar1,uVar2);
    if (uVar2 == 0x3e) break;
LAB_0014433c:
    do {
      uVar2 = prvTidyReadChar(doc->docIn);
      if (uVar2 == 0xffffffff) {
LAB_00144572:
        uVar2 = pLVar1->lexsize;
        goto LAB_00144576;
      }
      prvTidyAddCharToLexer(pLVar1,uVar2);
    } while (uVar2 != 0x25);
  }
  uVar2 = pLVar1->lexsize - 2;
  pLVar1->lexsize = uVar2;
LAB_00144576:
  pLVar1->txtend = uVar2;
  if (pLVar1->txtstart < uVar2) {
    pNVar5 = NewToken(doc,AspTag);
    uVar2 = pLVar1->txtend;
  }
  else {
    pNVar5 = (Node *)0x0;
  }
  pLVar1->txtstart = uVar2;
  *asp = pNVar5;
  return (tmbstr)0x0;
}

Assistant:

static tmbstr  ParseAttribute( TidyDocImpl* doc, Bool *isempty,
                              Node **asp, Node **php )
{
    Lexer* lexer = doc->lexer;
    int start, len = 0;
    tmbstr attr = NULL;
    uint c, lastc;

    *asp = NULL;  /* clear asp pointer */
    *php = NULL;  /* clear php pointer */

 /* skip white space before the attribute */

    for (;;)
    {
        c = TY_(ReadChar)( doc->docIn );


        if (c == '/')
        {
            c = TY_(ReadChar)( doc->docIn );

            if (c == '>')
            {
                *isempty = yes;
                return NULL;
            }

            TY_(UngetChar)(c, doc->docIn);
            c = '/';
            break;
        }

        if (c == '>')
            return NULL;

        if (c =='<')
        {
            c = TY_(ReadChar)(doc->docIn);

            if (c == '%')
            {
                *asp = ParseAsp( doc );
                return NULL;
            }
            else if (c == '?')
            {
                *php = ParsePhp( doc );
                return NULL;
            }

            TY_(UngetChar)(c, doc->docIn);
            TY_(UngetChar)('<', doc->docIn);
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
            return NULL;
        }

        if (c == '=')
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_EQUALSIGN );
            continue;
        }

        if (c == '"' || c == '\'')
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_QUOTEMARK );
            continue;
        }

        if (c == EndOfStream)
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
            TY_(UngetChar)(c, doc->docIn);
            return NULL;
        }


        if (!TY_(IsWhite)(c))
           break;
    }

    start = lexer->lexsize;
    lastc = c;

    for (;;)
    {
     /* but push back '=' for parseValue() */
        if (c == '=' || c == '>')
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (c == '<' || c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (lastc == '-' && (c == '"' || c == '\''))
        {
            lexer->lexsize--;
            --len;
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (TY_(IsWhite)(c))
            break;

        if (c == '/') /* Issue #395 - potential self closing tag */
        {
            c = TY_(ReadChar)(doc->docIn);  /* read next */
            if (c == '>')
            {
                /* got a self closing tag - put is back and continue... */
                TY_(UngetChar)(c, doc->docIn);
                break;
            }
            else
            {
                /* Not '/>' - put it back */
                TY_(UngetChar)(c, doc->docIn);
                c = '/';  /* restore original char */
            }
        }

        /* what should be done about non-namechar characters? */
        /* currently these are incorporated into the attr name */

        if ( cfg(doc, TidyUpperCaseAttrs) != TidyUppercasePreserve )
        {
            if ( !cfgBool(doc, TidyXmlTags) && TY_(IsUpper)(c) )
                c = TY_(ToLower)(c);
        }

        TY_(AddCharToLexer)( lexer, c );
        lastc = c;
        c = TY_(ReadChar)(doc->docIn);
    }

    /* handle attribute names with multibyte chars */
    len = lexer->lexsize - start;
    attr = (len > 0 ? TY_(tmbstrndup)(doc->allocator,
                                      lexer->lexbuf+start, len) : NULL);
    lexer->lexsize = start;
    return attr;
}